

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.cpp
# Opt level: O2

int main(void)

{
  pointer piVar1;
  istream *piVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  ostream *poVar5;
  vector<int,std::allocator<int>> *pvVar6;
  uint uVar7;
  int i;
  int iVar8;
  int y;
  int seq;
  int x;
  int op;
  int q;
  int n;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  dyn;
  int local_7c;
  int local_78;
  int local_74;
  uint local_70;
  int local_6c;
  int local_68;
  int local_64;
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  piVar2 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_64);
  std::istream::operator>>(piVar2,&local_68);
  uVar7 = 0;
  for (iVar8 = 0; iVar8 < local_68; iVar8 = iVar8 + 1) {
    piVar2 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_6c);
    piVar2 = (istream *)std::istream::operator>>(piVar2,(int *)&local_70);
    std::istream::operator>>(piVar2,&local_78);
    local_74 = (int)(local_70 ^ uVar7) % local_64;
    if (local_6c == 1) {
      iVar3 = std::
              _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::find(&local_60,&local_74);
      if ((_Rb_tree_header *)iVar3._M_node == &local_60._M_impl.super__Rb_tree_header) {
        local_7c = local_78;
        pvVar6 = (vector<int,std::allocator<int>> *)
                 std::
                 map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                 ::operator[]((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                               *)&local_60,&local_74);
        std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>(pvVar6,&local_7c,&local_78);
      }
      else {
        pmVar4 = std::
                 map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                 ::operator[]((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                               *)&local_60,&local_74);
        std::vector<int,_std::allocator<int>_>::push_back(pmVar4,&local_78);
      }
    }
    else {
      pmVar4 = std::
               map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
               ::operator[]((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                             *)&local_60,&local_74);
      piVar1 = (pmVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar7 = piVar1[(ulong)(long)local_78 %
                     (ulong)((long)(pmVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_finish - (long)piVar1 >> 2)];
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar7);
      std::endl<char,std::char_traits<char>>(poVar5);
    }
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree(&local_60);
  return 0;
}

Assistant:

int main() {
  std::map<int, std::vector<int>> dyn;
  int n, q, op, x, y, seq, last_answer = 0;
  std::cin >> n >> q;
  for (int i = 0; i < q; ++i) {
    std::cin >> op >> x >> y;
    seq = (x ^ last_answer) % n;
    if (op == 1) {
      if (dyn.find(seq) == dyn.end()) {
        dyn[seq] = {y};
      } else {
        dyn[seq].push_back(y);
      }
    } else {
      const auto &s = dyn[seq];
      last_answer = s[y % s.size()];
      std::cout << last_answer << std::endl;
    }
  }
}